

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_str_append_text_runes(nk_str *str,nk_rune *text,int len)

{
  int len_00;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  nk_glyph glyph;
  
  if (str != (nk_str *)0x0) {
    iVar1 = 0;
    if (len != 0 && text != (nk_rune *)0x0) {
      uVar3 = 0;
      uVar2 = 0;
      if (0 < len) {
        uVar2 = (ulong)(uint)len;
      }
      while ((iVar1 = len, uVar2 != uVar3 &&
             (len_00 = nk_utf_encode(text[uVar3],glyph,4), len_00 != 0))) {
        nk_str_append_text_char(str,glyph,len_00);
        uVar3 = uVar3 + 1;
      }
    }
    return iVar1;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x2057,"int nk_str_append_text_runes(struct nk_str *, const nk_rune *, int)");
}

Assistant:

NK_API int
nk_str_append_text_runes(struct nk_str *str, const nk_rune *text, int len)
{
    int i = 0;
    int byte_len = 0;
    nk_glyph glyph;

    NK_ASSERT(str);
    if (!str || !text || !len) return 0;
    for (i = 0; i < len; ++i) {
        byte_len = nk_utf_encode(text[i], glyph, NK_UTF_SIZE);
        if (!byte_len) break;
        nk_str_append_text_char(str, glyph, byte_len);
    }
    return len;
}